

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::Directory::transfer
          (Directory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,PathPtr fromPath
          ,TransferMode mode)

{
  bool bVar1;
  uint uVar2;
  Fault local_78;
  Fault f_1;
  Fault local_60;
  Fault f;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  Directory *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (Directory *)toPath.parts.ptr;
  f.exception = (Exception *)fromPath.parts.ptr;
  uVar2 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                    (this,this_local,toPath_local.parts.ptr,(ulong)toMode,fromDirectory,(ulong)mode,
                     fromPath.parts.ptr,fromPath.parts.size_);
  if ((uVar2 & 1) == 0) {
    bVar1 = has<kj::WriteMode,void>(toMode,CREATE);
    if (bVar1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],kj::PathPtr&,kj::PathPtr&>
                (&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x27e,FAILED,(char *)0x0,
                 "\"toPath already exists or fromPath doesn\'t exist\", toPath, fromPath",
                 (char (*) [48])"toPath already exists or fromPath doesn\'t exist",
                 (PathPtr *)&this_local,&fromPath);
      _::Debug::Fault::~Fault(&local_60);
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],kj::PathPtr&>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x282,FAILED,(char *)0x0,"\"fromPath doesn\'t exist\", fromPath",
                 (char (*) [23])0x67c6c0,&fromPath);
      _::Debug::Fault::~Fault(&local_78);
    }
  }
  return;
}

Assistant:

void Directory::transfer(PathPtr toPath, WriteMode toMode,
                         const Directory& fromDirectory, PathPtr fromPath,
                         TransferMode mode) const {
  if (!tryTransfer(toPath, toMode, fromDirectory, fromPath, mode)) {
    if (has(toMode, WriteMode::CREATE)) {
      KJ_FAIL_REQUIRE("toPath already exists or fromPath doesn't exist", toPath, fromPath) {
        break;
      }
    } else {
      KJ_FAIL_ASSERT("fromPath doesn't exist", fromPath) { break; }
    }
  }
}